

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogf_tools.cxx
# Opt level: O1

void __thiscall ogf_tools::process(ogf_tools *this,cl_parser *cl)

{
  char *pcVar1;
  bool bVar2;
  target_format tVar3;
  int iVar4;
  xr_ogf *pxVar5;
  uint uVar6;
  long lVar7;
  size_t sVar8;
  char *sg_val;
  allocator<char> local_71;
  ogf_tools *local_70;
  undefined4 local_64;
  ulong local_60;
  char *local_58;
  string local_50;
  
  local_70 = this;
  tVar3 = object_tools::get_target_format(&this->super_object_tools,cl);
  if ((tVar3 != TARGET_ERROR) && (tVar3 != TARGET_INFO)) {
    local_58 = (char *)0x0;
    bVar2 = cl_parser::get_string(cl,"-sg",&local_58);
    pcVar1 = local_58;
    local_64 = 0;
    if ((bVar2) && (iVar4 = strcmp(local_58,"soc"), iVar4 != 0)) {
      iVar4 = strcmp(pcVar1,"cscop");
      if (iVar4 != 0) {
        xray_re::msg("invalid `-sg` param");
        return;
      }
      local_64 = 1;
    }
    bVar2 = batch_helper::prepare_target_name(&(local_70->super_object_tools).super_batch_helper,cl)
    ;
    if ((bVar2) && (sVar8 = cl->m_num_params, sVar8 != 0)) {
      uVar6 = tVar3 >> 1 | (uint)((tVar3 & TARGET_INFO) != TARGET_DEFAULT) << 0x1f;
      lVar7 = -0x18;
      local_60 = (ulong)uVar6;
      do {
        pcVar1 = *(char **)((long)&cl->m_options[cl->m_argc].name + lVar7);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_71);
        pxVar5 = xray_re::xr_ogf::load_ogf(&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if (pxVar5 == (xr_ogf *)0x0) {
          xray_re::msg("can\'t load %s",pcVar1);
        }
        else if (uVar6 < 9) {
          (*(code *)(&DAT_001eaa40 + *(int *)(&DAT_001eaa40 + local_60 * 4)))();
          return;
        }
        if (pxVar5 != (xr_ogf *)0x0) {
          (*(pxVar5->super_xr_object).super_xr_surface_factory._vptr_xr_surface_factory[1])(pxVar5);
        }
        lVar7 = lVar7 + -0x18;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
    return;
  }
  xray_re::msg("unsupported options combination");
  return;
}

Assistant:

void ogf_tools::process(const cl_parser& cl)
{
	target_format format = get_target_format(cl);
	switch (format) {
	case TARGET_INFO:
	case TARGET_ERROR:
		msg("unsupported options combination");
		return;
	default:
		break;
	}

	xr_sg_type sg_type = xr_sg_type::SOC;
	const char* sg_val = 0;
	if (!cl.get_string("-sg", sg_val)) {
		sg_type = xr_sg_type::SOC;
	}
	else if (std::strcmp(sg_val, "soc") == 0) {
		sg_type = xr_sg_type::SOC;
	}
	else if (std::strcmp(sg_val, "cscop") == 0) {
		sg_type = xr_sg_type::CSCOP;
	}
	else {
		msg("invalid `-sg` param");
		return;
	}

	if (!prepare_target_name(cl))
		return;

	for (size_t i = 0, num_params = cl.num_params(); i != num_params; ++i) {
		const char* source = cl.param(i);
		xr_ogf* ogf = xr_ogf::load_ogf(source);
		if (ogf) {
			switch (format) {
			case TARGET_DEFAULT:
			case TARGET_OBJECT:
				save_object(*ogf, source, sg_type);
				break;
			case TARGET_SKLS:
				if (ogf->motions().empty()) {
					msg("object has no own motions");
				} else {
					save_skls(*ogf, source);
				}
				break;
			case TARGET_SKL:
				save_skl(*ogf, source, cl);
				break;
			case TARGET_BONES:
				save_bones(*ogf, source);
				break;
			default:
				break;
			}
		} else {
			msg("can't load %s", source);
		}
		delete ogf;
	}
}